

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

bool tinyformat::detail::parseWidthOrPrecision
               (int *n,char **c,bool positionalMode,FormatArg *args,int *argIndex,int numArgs)

{
  int iVar1;
  undefined8 uVar2;
  byte in_DL;
  long *in_RSI;
  int *in_RDI;
  int *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  int pos;
  string *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  allocator<char> *in_stack_ffffffffffffff48;
  allocator<char> *__a;
  undefined1 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff51;
  undefined1 in_stack_ffffffffffffff52;
  undefined1 in_stack_ffffffffffffff53;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffff54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  bool local_6c;
  allocator<char> local_69 [97];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(char *)*in_RSI < '0') || ('9' < *(char *)*in_RSI)) {
    if (*(char *)*in_RSI == '*') {
      *in_RSI = *in_RSI + 1;
      *in_RDI = 0;
      if ((in_DL & 1) == 0) {
        if (in_R9D <= *in_R8) {
          uVar3 = 1;
          uVar2 = __cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffff58,
                     (char *)CONCAT44(in_stack_ffffffffffffff54,
                                      CONCAT13(in_stack_ffffffffffffff53,
                                               CONCAT12(in_stack_ffffffffffffff52,
                                                        CONCAT11(uVar3,in_stack_ffffffffffffff50))))
                     ,in_stack_ffffffffffffff48);
          format_error::format_error
                    ((format_error *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                     in_stack_ffffffffffffff10);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar2,&format_error::typeinfo,format_error::~format_error);
          }
          goto LAB_00132310;
        }
        *in_R8 = *in_R8 + 1;
        iVar1 = FormatArg::toInt((FormatArg *)
                                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        *in_RDI = iVar1;
      }
      else {
        iVar1 = parseIntAndAdvance((char **)CONCAT17(in_stack_ffffffffffffff1f,
                                                     in_stack_ffffffffffffff18));
        if (*(char *)*in_RSI != '$') {
          uVar3 = 1;
          uVar2 = __cxa_allocate_exception(0x10);
          __a = local_69;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffff58,
                     (char *)CONCAT44(in_stack_ffffffffffffff54,
                                      CONCAT13(uVar3,CONCAT12(in_stack_ffffffffffffff52,
                                                              CONCAT11(in_stack_ffffffffffffff51,
                                                                       in_stack_ffffffffffffff50))))
                     ,__a);
          format_error::format_error
                    ((format_error *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                     in_stack_ffffffffffffff10);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar2,&format_error::typeinfo,format_error::~format_error);
          }
          goto LAB_00132310;
        }
        if ((iVar1 + -1 < 0) || (in_R9D <= iVar1 + -1)) {
          uVar3 = 1;
          uVar2 = __cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffff58,
                     (char *)CONCAT44(in_stack_ffffffffffffff54,
                                      CONCAT13(in_stack_ffffffffffffff53,
                                               CONCAT12(uVar3,CONCAT11(in_stack_ffffffffffffff51,
                                                                       in_stack_ffffffffffffff50))))
                     ,in_stack_ffffffffffffff48);
          format_error::format_error
                    ((format_error *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                     in_stack_ffffffffffffff10);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar2,&format_error::typeinfo,format_error::~format_error);
          }
          goto LAB_00132310;
        }
        iVar1 = FormatArg::toInt((FormatArg *)
                                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        *in_RDI = iVar1;
        *in_RSI = *in_RSI + 1;
      }
      goto LAB_001322af;
    }
    local_6c = false;
  }
  else {
    iVar1 = parseIntAndAdvance((char **)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18
                                                ));
    *in_RDI = iVar1;
LAB_001322af:
    local_6c = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_6c;
  }
LAB_00132310:
  __stack_chk_fail();
}

Assistant:

inline bool parseWidthOrPrecision(int& n, const char*& c, bool positionalMode,
                                  const detail::FormatArg* args,
                                  int& argIndex, int numArgs)
{
    if (*c >= '0' && *c <= '9') {
        n = parseIntAndAdvance(c);
    }
    else if (*c == '*') {
        ++c;
        n = 0;
        if (positionalMode) {
            int pos = parseIntAndAdvance(c) - 1;
            if (*c != '$')
                TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
            if (pos >= 0 && pos < numArgs)
                n = args[pos].toInt();
            else
                TINYFORMAT_ERROR("tinyformat: Positional argument out of range");
            ++c;
        }
        else {
            if (argIndex < numArgs)
                n = args[argIndex++].toInt();
            else
                TINYFORMAT_ERROR("tinyformat: Not enough arguments to read variable width or precision");
        }
    }
    else {
        return false;
    }
    return true;
}